

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O1

void duckdb::ArraySliceFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  FunctionData FVar2;
  Vector VVar3;
  UnifiedVectorFormat *pUVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  anon_union_16_2_67f50693_for_value *paVar6;
  long *plVar7;
  list_entry_t *plVar8;
  long *plVar9;
  undefined8 uVar10;
  char *pcVar11;
  string_t input;
  string_t sVar12;
  string_t input_00;
  string_t sVar13;
  string_t sVar14;
  string_t input_01;
  string_t sVar15;
  string_t input_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  long __tmp;
  reference pvVar21;
  reference pvVar22;
  SelectionVector *pSVar23;
  BoundFunctionExpression *pBVar24;
  pointer pFVar25;
  SelectionVector *pSVar26;
  undefined8 *puVar27;
  UnifiedVectorFormat *pUVar28;
  TemplatedValidityData<unsigned_long> *pTVar29;
  idx_t iVar30;
  NotImplementedException *this;
  UnifiedVectorFormat *pUVar31;
  element_type *peVar32;
  UnifiedVectorFormat *pUVar33;
  uint64_t *puVar34;
  idx_t iVar35;
  long lVar36;
  byte bVar37;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar38;
  sel_t sVar39;
  UnifiedVectorFormat *pUVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  byte bVar46;
  long lVar47;
  uint64_t uVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  list_entry_t lVar53;
  anon_union_16_2_67f50693_for_value aVar54;
  list_entry_t lVar55;
  list_entry_t input_03;
  undefined7 in_stack_fffffffffffffde8;
  FunctionData FVar56;
  idx_t local_200;
  optional_ptr<duckdb::Vector,_true> local_1f0;
  long begin_4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  list_entry_t sliced;
  optional_ptr<duckdb::Vector,_true> local_1b8;
  long end;
  idx_t local_1a8;
  long begin_1;
  SelectionVector sel;
  idx_t local_178;
  unsigned_long local_170;
  UnifiedVectorFormat begin_data;
  long lStack_160;
  long local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  list_entry_t str;
  long local_108 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  long begin;
  long local_c0;
  long local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  UnifiedVectorFormat end_data;
  long local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  pUVar4 = *(UnifiedVectorFormat **)(args + 0x18);
  pvVar21 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::VectorOperations::Copy(pvVar21,result,(ulong)pUVar4,0,0);
  if (result[8] == (Vector)0x1) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  pvVar21 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  pvVar22 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  if (*(long *)(args + 8) - *(long *)args == 0x1a0) {
    pSVar23 = (SelectionVector *)
              vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,3);
  }
  else {
    pSVar23 = (SelectionVector *)0x0;
  }
  pBVar24 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar25 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        *)(pBVar24 + 0x198));
  FVar56 = pFVar25[0x20];
  FVar2 = pFVar25[0x21];
  duckdb::DataChunk::AllConstant();
  duckdb::Vector::SetVectorType((VectorType)result);
  VVar3 = result[8];
  if (VVar3 == (Vector)0x19) {
    if (pSVar23 == (SelectionVector *)0x0) {
      pSVar26 = (SelectionVector *)0x0;
    }
    else {
      pSVar26 = (SelectionVector *)duckdb::ListVector::GetEntry(result);
    }
    sel.sel_vector = (sel_t *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178 = 0;
    if (*result == (Vector)0x2) {
      if (*(byte **)(result + 0x28) == (byte *)0x0) {
        bVar50 = false;
      }
      else {
        bVar50 = (**(byte **)(result + 0x28) & 1) == 0;
      }
      if (*(byte **)(pvVar21 + 0x28) == (byte *)0x0) {
        bVar51 = false;
      }
      else {
        bVar51 = (**(byte **)(pvVar21 + 0x28) & 1) == 0;
      }
      if (*(byte **)(pvVar22 + 0x28) == (byte *)0x0) {
        bVar52 = false;
      }
      else {
        bVar52 = (**(byte **)(pvVar22 + 0x28) & 1) == 0;
      }
      begin = (long)pSVar26;
      _end_data = pSVar23;
      if (pSVar23 == (SelectionVector *)0x0) {
        bVar37 = 0;
      }
      else {
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&end_data);
        p_Var5 = _end_data[1].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar37 = 1;
        }
        else {
          bVar37 = *(byte *)&p_Var5->_vptr__Sp_counted_base & 1;
        }
      }
      if (((bVar50 || bVar51) || bVar52) || (_end_data != (SelectionVector *)0x0 && bVar37 == 0)) {
        duckdb::ConstantVector::SetNull(result,true);
      }
      else {
        paVar6 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
        plVar9 = *(long **)(pvVar21 + 0x20);
        plVar7 = *(long **)(pvVar22 + 0x20);
        if (_end_data == (SelectionVector *)0x0) {
          peVar32 = (element_type *)0x0;
        }
        else {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          peVar32 = _end_data[1].selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        uVar19 = str.offset._4_4_;
        uVar17 = (undefined4)str.offset;
        _begin_data = *(SelectionVector **)paVar6;
        pcVar11 = (paVar6->pointer).ptr;
        if (FVar56 == (FunctionData)0x0) {
          begin_4 = *plVar9;
        }
        else {
          begin_4 = 0;
        }
        str.offset._0_4_ = SUB84(_begin_data,0);
        uVar18 = (undefined4)str.offset;
        str.offset._4_4_ = (undefined4)((ulong)_begin_data >> 0x20);
        uVar20 = str.offset._4_4_;
        if (FVar2 == (FunctionData)0x0) {
          lVar45 = *plVar7;
          lVar41 = lVar45;
          str.offset._0_4_ = uVar17;
          str.offset._4_4_ = uVar19;
        }
        else {
          if (((ulong)_begin_data & 0xffffffff) == 0) {
            lVar41 = 0;
          }
          else {
            uVar42 = 0;
            lVar41 = 0;
            do {
              lVar41 = lVar41 + 1;
              uVar42 = uVar42 + 1;
            } while (((ulong)_begin_data & 0xffffffff) != uVar42);
          }
          lVar45 = 0;
          str.length = (uint64_t)pcVar11;
        }
        sliced.offset._0_4_ = (undefined4)lVar41;
        sliced.offset._4_4_ = (undefined4)((ulong)lVar41 >> 0x20);
        if (peVar32 == (element_type *)0x0) {
          lVar41 = 1;
        }
        else {
          lVar41 = *(long *)peVar32;
        }
        if (lVar41 < 0) {
          if (FVar56 != (FunctionData)0x0) {
            str.offset._0_4_ = uVar18;
            str.offset._4_4_ = uVar20;
            if (((ulong)_begin_data & 0xffffffff) == 0) {
              begin_4 = 0;
              str.length = (uint64_t)pcVar11;
            }
            else {
              uVar42 = 0;
              begin_4 = 0;
              do {
                begin_4 = begin_4 + 1;
                uVar42 = uVar42 + 1;
                str.length = (uint64_t)pcVar11;
              } while (((ulong)_begin_data & 0xffffffff) != uVar42);
            }
          }
          sliced.offset._0_4_ = (undefined4)begin_4;
          sliced.offset._4_4_ = (undefined4)((ulong)begin_4 >> 0x20);
          begin_4 = lVar45;
        }
        bVar46 = lVar41 == 1 | bVar37;
        if (bVar46 == 1) {
          ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                    ((string_t *)&begin_data,&begin_4,(long *)&sliced);
        }
        if ((bVar37 == 1 && lVar41 != 1) &&
           (begin_4 < (long)CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))) {
          iVar30 = CalculateSliceLength<long>
                             (begin_4,CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar41
                              ,true);
          bVar50 = true;
          SelectionVector::Initialize(&sel,iVar30);
        }
        else {
          bVar50 = false;
          iVar30 = 0;
        }
        if (bVar46 == 0) {
          duckdb::ConstantVector::SetNull(result,true);
        }
        else {
          input_01.value.pointer.ptr = pcVar11;
          input_01.value._0_8_ = _begin_data;
          sVar14.value.pointer.ptr = pcVar11;
          sVar14.value._0_8_ = _begin_data;
          if (lVar41 == 1) {
            aVar54 = (anon_union_16_2_67f50693_for_value)
                     duckdb::SubstringUnicode
                               (result,sVar14,begin_4 + 1,
                                CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) - begin_4);
          }
          else {
            aVar54.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringSliceOperations::SliceValueWithSteps
                           (result,&sel,input_01,begin_4,
                            CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar41,
                            &local_178);
          }
          *paVar6 = aVar54;
        }
        if (bVar50) {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin);
          duckdb::Vector::Slice((SelectionVector *)begin,(ulong)&sel);
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin);
          duckdb::Vector::Flatten(begin);
          duckdb::ListVector::SetListSize(result,iVar30);
        }
      }
    }
    else {
      local_1f0.ptr = (Vector *)pSVar23;
      local_1b8.ptr = (Vector *)pSVar26;
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&begin);
      duckdb::Vector::ToUnifiedFormat((ulong)result,pUVar4);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar21,pUVar4);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar22,pUVar4);
      if ((SelectionVector *)local_1f0.ptr != (SelectionVector *)0x0) {
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1f0);
        duckdb::Vector::ToUnifiedFormat((ulong)local_1f0.ptr,pUVar4);
        iVar30 = duckdb::ListVector::GetListSize(result);
        SelectionVector::Initialize(&sel,iVar30);
      }
      lVar45 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      if (pUVar4 == (UnifiedVectorFormat *)0x0) {
        local_1a8 = 0;
      }
      else {
        local_1a8 = 0;
        pUVar38 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar28 = pUVar38;
          if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
            pUVar28 = (UnifiedVectorFormat *)
                      (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                      (long)pUVar38 * 4);
          }
          pUVar40 = pUVar38;
          if (_begin_data->sel_vector != (sel_t *)0x0) {
            pUVar40 = (UnifiedVectorFormat *)(ulong)_begin_data->sel_vector[(long)pUVar38];
          }
          pUVar33 = pUVar38;
          if (_end_data->sel_vector != (sel_t *)0x0) {
            pUVar33 = (UnifiedVectorFormat *)(ulong)_end_data->sel_vector[(long)pUVar38];
          }
          if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
            pUVar31 = (UnifiedVectorFormat *)0x0;
          }
          else {
            pUVar31 = pUVar38;
            if (*(long *)begin != 0) {
              pUVar31 = (UnifiedVectorFormat *)(ulong)*(uint *)(*(long *)begin + (long)pUVar38 * 4);
            }
          }
          if (local_108[0] == 0) {
            bVar50 = false;
          }
          else {
            bVar50 = (*(ulong *)(local_108[0] + ((ulong)pUVar28 >> 6) * 8) >>
                      ((ulong)pUVar28 & 0x3f) & 1) == 0;
          }
          if (local_158 == 0) {
            bVar51 = false;
          }
          else {
            bVar51 = (*(ulong *)(local_158 + ((ulong)pUVar40 >> 6) * 8) >> ((ulong)pUVar40 & 0x3f) &
                     1) == 0;
          }
          if (local_70 == 0) {
            bVar52 = false;
          }
          else {
            bVar52 = (*(ulong *)(local_70 + ((ulong)pUVar33 >> 6) * 8) >> ((ulong)pUVar33 & 0x3f) &
                     1) == 0;
          }
          if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
            bVar49 = false;
          }
          else if (local_b8 == 0) {
            bVar49 = true;
          }
          else {
            bVar49 = (*(ulong *)(local_b8 + ((ulong)pUVar31 >> 6) * 8) >> ((ulong)pUVar31 & 0x3f) &
                     1) != 0;
          }
          if (((bVar50 || bVar51) || bVar52) ||
             ((SelectionVector *)local_1f0.ptr != (SelectionVector *)0x0 && !bVar49)) {
            if (*(long *)(result + 0x28) == 0) {
              sliced.offset._0_4_ = (undefined4)*(undefined8 *)(result + 0x40);
              sliced.offset._4_4_ = (undefined4)((ulong)*(undefined8 *)(result + 0x40) >> 0x20);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&begin_4,&sliced.offset);
              p_Var16 = p_Stack_1e0;
              lVar41 = begin_4;
              begin_4 = 0;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(long *)(result + 0x30) = lVar41;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var16;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
              }
              pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(result + 0x30));
              *(unsigned_long **)(result + 0x28) =
                   (pTVar29->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            bVar37 = (byte)pUVar38 & 0x3f;
            puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar38 >> 6) * 8);
            *puVar1 = *puVar1 & (-2L << bVar37 | 0xfffffffffffffffeU >> 0x40 - bVar37);
          }
          else {
            puVar1 = (ulong *)(str.length + (long)pUVar28 * 0x10);
            uVar42 = *puVar1;
            sliced.length = puVar1[1];
            sliced.offset._0_4_ = (undefined4)uVar42;
            sliced.offset._4_4_ = (undefined4)(uVar42 >> 0x20);
            if (FVar56 == (FunctionData)0x0) {
              begin_1 = *(long *)(lStack_160 + (long)pUVar40 * 8);
            }
            else {
              begin_1 = 0;
            }
            if (FVar2 == (FunctionData)0x0) {
              lVar41 = *(long *)(local_78 + (long)pUVar33 * 8);
              end = lVar41;
            }
            else {
              if ((uVar42 & 0xffffffff) == 0) {
                end = 0;
              }
              else {
                uVar43 = 0;
                end = 0;
                do {
                  end = end + 1;
                  uVar43 = uVar43 + 1;
                } while ((uVar42 & 0xffffffff) != uVar43);
              }
              lVar41 = 0;
              begin_4 = uVar42;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced.length;
            }
            if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
              lVar44 = 1;
            }
            else {
              lVar44 = *(long *)(local_c0 + (long)pUVar31 * 8);
            }
            if ((lVar44 < 0) && (end = begin_1, begin_1 = lVar41, FVar56 != (FunctionData)0x0)) {
              if ((uVar42 & 0xffffffff) == 0) {
                end = 0;
                begin_4 = uVar42;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced.length;
              }
              else {
                uVar43 = 0;
                end = 0;
                do {
                  end = end + 1;
                  uVar43 = uVar43 + 1;
                  begin_4 = uVar42;
                  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced.length;
                } while ((uVar42 & 0xffffffff) != uVar43);
              }
            }
            bVar50 = (bool)(lVar44 == 1 | bVar49);
            if (bVar50) {
              ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                        ((string_t *)&sliced,&begin_1,&end);
            }
            lVar36 = begin_1;
            lVar41 = end;
            lVar47 = end - begin_1;
            if (lVar47 == 0 || end < begin_1) {
              local_200 = 0;
            }
            else {
              local_200 = CalculateSliceLength<long>(begin_1,end,lVar44,bVar49);
            }
            if (bVar50) {
              sVar13.value._4_1_ = sliced.offset._4_1_;
              sVar13.value._5_1_ = sliced.offset._5_1_;
              sVar13.value._6_1_ = sliced.offset._6_1_;
              sVar13.value._7_1_ = sliced.offset._7_1_;
              sVar13.value.pointer.length = (undefined4)sliced.offset;
              sVar13.value.pointer.ptr = (char *)sliced.length;
              input_00.value._4_1_ = sliced.offset._4_1_;
              input_00.value._5_1_ = sliced.offset._5_1_;
              input_00.value._6_1_ = sliced.offset._6_1_;
              input_00.value._7_1_ = sliced.offset._7_1_;
              input_00.value.pointer.length = (undefined4)sliced.offset;
              input_00.value.pointer.ptr = (char *)sliced.length;
              if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
                aVar54 = (anon_union_16_2_67f50693_for_value)
                         duckdb::SubstringUnicode(result,sVar13,lVar36 + 1,lVar47);
              }
              else {
                aVar54.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     StringSliceOperations::SliceValueWithSteps
                               (result,&sel,input_00,lVar36,lVar41,lVar44,&local_178);
              }
              *(long *)(lVar45 + (long)pUVar38 * 0x10) = aVar54._0_8_;
              *(char **)(lVar45 + 8 + (long)pUVar38 * 0x10) = aVar54.pointer.ptr;
            }
            else {
              if (*(long *)(result + 0x28) == 0) {
                local_170 = *(unsigned_long *)(result + 0x40);
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&begin_4,&local_170);
                p_Var16 = p_Stack_1e0;
                lVar41 = begin_4;
                begin_4 = 0;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                *(long *)(result + 0x30) = lVar41;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var16;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
                }
                pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)(result + 0x30));
                *(unsigned_long **)(result + 0x28) =
                     (pTVar29->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              }
              bVar37 = (byte)pUVar38 & 0x3f;
              puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar38 >> 6) * 8);
              *puVar1 = *puVar1 & (-2L << bVar37 | 0xfffffffffffffffeU >> 0x40 - bVar37);
            }
            local_1a8 = local_1a8 + local_200;
          }
          pUVar38 = pUVar38 + 1;
        } while (pUVar38 != pUVar4);
      }
      iVar30 = local_1a8;
      if ((SelectionVector *)local_1f0.ptr != (SelectionVector *)0x0) {
        SelectionVector::SelectionVector((SelectionVector *)&begin_4,local_1a8);
        if (iVar30 != 0) {
          iVar35 = 0;
          do {
            sVar39 = (sel_t)iVar35;
            if (sel.sel_vector != (sel_t *)0x0) {
              sVar39 = sel.sel_vector[iVar35];
            }
            *(sel_t *)(begin_4 + iVar35 * 4) = sVar39;
            iVar35 = iVar35 + 1;
          } while (iVar30 != iVar35);
        }
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        duckdb::Vector::Slice((SelectionVector *)local_1b8.ptr,(ulong)&begin_4);
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        duckdb::Vector::Flatten((ulong)local_1b8.ptr);
        duckdb::ListVector::SetListSize(result,iVar30);
        if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
        }
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
      }
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
      }
      if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
      }
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
      }
    }
    duckdb::Vector::Verify((ulong)result);
  }
  else if (VVar3 == (Vector)0x1a) {
    if (pSVar23 == (SelectionVector *)0x0) {
      pSVar26 = (SelectionVector *)0x0;
    }
    else {
      pSVar26 = (SelectionVector *)duckdb::ListVector::GetEntry(result);
    }
    sel.sel_vector = (sel_t *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178 = 0;
    if (*result == (Vector)0x2) {
      if (*(byte **)(result + 0x28) == (byte *)0x0) {
        bVar50 = false;
      }
      else {
        bVar50 = (**(byte **)(result + 0x28) & 1) == 0;
      }
      if (*(byte **)(pvVar21 + 0x28) == (byte *)0x0) {
        bVar51 = false;
      }
      else {
        bVar51 = (**(byte **)(pvVar21 + 0x28) & 1) == 0;
      }
      if (*(byte **)(pvVar22 + 0x28) == (byte *)0x0) {
        bVar52 = false;
      }
      else {
        bVar52 = (**(byte **)(pvVar22 + 0x28) & 1) == 0;
      }
      _end_data = pSVar26;
      if (pSVar23 == (SelectionVector *)0x0) {
        bVar37 = 0;
        _begin_data = pSVar23;
      }
      else {
        _begin_data = pSVar23;
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
        p_Var5 = _begin_data[1].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar37 = 1;
        }
        else {
          bVar37 = *(byte *)&p_Var5->_vptr__Sp_counted_base & 1;
        }
      }
      if (((bVar50 || bVar51) || bVar52) || (_begin_data != (SelectionVector *)0x0 && bVar37 == 0))
      {
        duckdb::ConstantVector::SetNull(result,true);
      }
      else {
        paVar6 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
        plVar9 = *(long **)(pvVar21 + 0x20);
        puVar1 = *(ulong **)(pvVar22 + 0x20);
        if (_begin_data == (SelectionVector *)0x0) {
          peVar32 = (element_type *)0x0;
        }
        else {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          peVar32 = _begin_data[1].selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        uVar42 = *(ulong *)paVar6;
        str.length = (uint64_t)(paVar6->pointer).ptr;
        str.offset._0_4_ = (undefined4)uVar42;
        str.offset._4_4_ = (undefined4)(uVar42 >> 0x20);
        if (FVar56 == (FunctionData)0x0) {
          begin = *plVar9;
        }
        else {
          begin = 0;
        }
        if (FVar2 == (FunctionData)0x0) {
          uVar43 = *puVar1;
          begin_4 = uVar43;
        }
        else {
          uVar43 = 0;
          begin_4 = uVar42 & 0xffffffff;
        }
        if (peVar32 == (element_type *)0x0) {
          lVar45 = 1;
        }
        else {
          lVar45 = *(long *)peVar32;
        }
        if ((lVar45 < 0) && (begin_4 = begin, begin = uVar43, FVar56 != (FunctionData)0x0)) {
          begin_4 = uVar42 & 0xffffffff;
        }
        bVar46 = lVar45 == 1 | bVar37;
        if (bVar46 == 1) {
          ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                    ((string_t *)&str,&begin,&begin_4);
        }
        if ((bVar37 == 1 && lVar45 != 1) && (begin < begin_4)) {
          iVar30 = CalculateSliceLength<long>(begin,begin_4,lVar45,true);
          bVar50 = true;
          SelectionVector::Initialize(&sel,iVar30);
        }
        else {
          bVar50 = false;
          iVar30 = 0;
        }
        if (bVar46 == 0) {
          duckdb::ConstantVector::SetNull(result,true);
        }
        else {
          input_02.value._4_1_ = str.offset._4_1_;
          input_02.value._5_1_ = str.offset._5_1_;
          input_02.value._6_1_ = str.offset._6_1_;
          input_02.value._7_1_ = str.offset._7_1_;
          input_02.value.pointer.length = (undefined4)str.offset;
          input_02.value.pointer.ptr = (char *)str.length;
          sVar15.value._4_1_ = str.offset._4_1_;
          sVar15.value._5_1_ = str.offset._5_1_;
          sVar15.value._6_1_ = str.offset._6_1_;
          sVar15.value._7_1_ = str.offset._7_1_;
          sVar15.value.pointer.length = (undefined4)str.offset;
          sVar15.value.pointer.ptr = (char *)str.length;
          if (lVar45 == 1) {
            aVar54 = (anon_union_16_2_67f50693_for_value)
                     duckdb::SubstringASCII(result,sVar15,begin + 1,begin_4 - begin);
          }
          else {
            aVar54.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 BlobSliceOperations::SliceValueWithSteps
                           (result,&sel,input_02,begin,begin_4,lVar45,&local_178);
          }
          *paVar6 = aVar54;
        }
        if (bVar50) {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          duckdb::Vector::Slice(_end_data,(ulong)&sel);
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          duckdb::Vector::Flatten((ulong)_end_data);
          duckdb::ListVector::SetListSize(result,iVar30);
        }
      }
    }
    else {
      local_1f0.ptr = (Vector *)pSVar23;
      local_1b8.ptr = (Vector *)pSVar26;
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&begin);
      duckdb::Vector::ToUnifiedFormat((ulong)result,pUVar4);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar21,pUVar4);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar22,pUVar4);
      if ((SelectionVector *)local_1f0.ptr != (SelectionVector *)0x0) {
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1f0);
        duckdb::Vector::ToUnifiedFormat((ulong)local_1f0.ptr,pUVar4);
        iVar30 = duckdb::ListVector::GetListSize(result);
        SelectionVector::Initialize(&sel,iVar30);
      }
      lVar45 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      if (pUVar4 == (UnifiedVectorFormat *)0x0) {
        local_1a8 = 0;
      }
      else {
        puVar27 = (undefined8 *)(lVar45 + 8);
        local_1a8 = 0;
        pUVar38 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar28 = pUVar38;
          if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
            pUVar28 = (UnifiedVectorFormat *)
                      (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                      (long)pUVar38 * 4);
          }
          pUVar40 = pUVar38;
          if (_begin_data->sel_vector != (sel_t *)0x0) {
            pUVar40 = (UnifiedVectorFormat *)(ulong)_begin_data->sel_vector[(long)pUVar38];
          }
          pUVar33 = pUVar38;
          if (_end_data->sel_vector != (sel_t *)0x0) {
            pUVar33 = (UnifiedVectorFormat *)(ulong)_end_data->sel_vector[(long)pUVar38];
          }
          if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
            pUVar31 = (UnifiedVectorFormat *)0x0;
          }
          else {
            pUVar31 = pUVar38;
            if (*(long *)begin != 0) {
              pUVar31 = (UnifiedVectorFormat *)(ulong)*(uint *)(*(long *)begin + (long)pUVar38 * 4);
            }
          }
          if (local_108[0] == 0) {
            bVar50 = false;
          }
          else {
            bVar50 = (*(ulong *)(local_108[0] + ((ulong)pUVar28 >> 6) * 8) >>
                      ((ulong)pUVar28 & 0x3f) & 1) == 0;
          }
          if (local_158 == 0) {
            bVar51 = false;
          }
          else {
            bVar51 = (*(ulong *)(local_158 + ((ulong)pUVar40 >> 6) * 8) >> ((ulong)pUVar40 & 0x3f) &
                     1) == 0;
          }
          if (local_70 == 0) {
            bVar52 = false;
          }
          else {
            bVar52 = (*(ulong *)(local_70 + ((ulong)pUVar33 >> 6) * 8) >> ((ulong)pUVar33 & 0x3f) &
                     1) == 0;
          }
          if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
            bVar49 = false;
          }
          else if (local_b8 == 0) {
            bVar49 = true;
          }
          else {
            bVar49 = (*(ulong *)(local_b8 + ((ulong)pUVar31 >> 6) * 8) >> ((ulong)pUVar31 & 0x3f) &
                     1) != 0;
          }
          if (((bVar50 || bVar51) || bVar52) ||
             ((SelectionVector *)local_1f0.ptr != (SelectionVector *)0x0 && bVar49 == false)) {
            if (*(long *)(result + 0x28) == 0) {
              sliced.offset._0_4_ = (undefined4)*(undefined8 *)(result + 0x40);
              sliced.offset._4_4_ = (undefined4)((ulong)*(undefined8 *)(result + 0x40) >> 0x20);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&begin_4,&sliced.offset);
              p_Var16 = p_Stack_1e0;
              lVar45 = begin_4;
              begin_4 = 0;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(long *)(result + 0x30) = lVar45;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var16;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
              }
              pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(result + 0x30));
              *(unsigned_long **)(result + 0x28) =
                   (pTVar29->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            bVar37 = (byte)pUVar38 & 0x3f;
            puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar38 >> 6) * 8);
            *puVar1 = *puVar1 & (-2L << bVar37 | 0xfffffffffffffffeU >> 0x40 - bVar37);
          }
          else {
            puVar1 = (ulong *)(str.length + (long)pUVar28 * 0x10);
            uVar42 = *puVar1;
            sliced.length = puVar1[1];
            sliced.offset._0_4_ = (undefined4)uVar42;
            sliced.offset._4_4_ = (undefined4)(uVar42 >> 0x20);
            if (FVar56 == (FunctionData)0x0) {
              begin_1 = *(long *)(lStack_160 + (long)pUVar40 * 8);
            }
            else {
              begin_1 = 0;
            }
            if (FVar2 == (FunctionData)0x0) {
              uVar43 = *(ulong *)(local_78 + (long)pUVar33 * 8);
              end = uVar43;
            }
            else {
              uVar43 = 0;
              end = uVar42 & 0xffffffff;
            }
            if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
              lVar45 = 1;
            }
            else {
              lVar45 = *(long *)(local_c0 + (long)pUVar31 * 8);
            }
            if ((lVar45 < 0) && (end = begin_1, begin_1 = uVar43, FVar56 != (FunctionData)0x0)) {
              end = uVar42 & 0xffffffff;
            }
            bVar37 = lVar45 == 1 | bVar49;
            if (bVar37 == 1) {
              ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                        ((string_t *)&sliced,&begin_1,&end);
            }
            lVar44 = begin_1;
            lVar41 = end;
            lVar36 = end - begin_1;
            if (lVar36 == 0 || end < begin_1) {
              iVar30 = 0;
            }
            else {
              iVar30 = CalculateSliceLength<long>(begin_1,end,lVar45,bVar49);
            }
            if (bVar37 == 0) {
              if (*(long *)(result + 0x28) == 0) {
                local_170 = *(unsigned_long *)(result + 0x40);
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&begin_4,&local_170);
                p_Var16 = p_Stack_1e0;
                lVar45 = begin_4;
                begin_4 = 0;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                *(long *)(result + 0x30) = lVar45;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var16;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
                }
                pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)(result + 0x30));
                *(unsigned_long **)(result + 0x28) =
                     (pTVar29->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              }
              bVar37 = (byte)pUVar38 & 0x3f;
              puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar38 >> 6) * 8);
              *puVar1 = *puVar1 & (-2L << bVar37 | 0xfffffffffffffffeU >> 0x40 - bVar37);
            }
            else {
              sVar12.value._4_1_ = sliced.offset._4_1_;
              sVar12.value._5_1_ = sliced.offset._5_1_;
              sVar12.value._6_1_ = sliced.offset._6_1_;
              sVar12.value._7_1_ = sliced.offset._7_1_;
              sVar12.value.pointer.length = (undefined4)sliced.offset;
              sVar12.value.pointer.ptr = (char *)sliced.length;
              input.value._4_1_ = sliced.offset._4_1_;
              input.value._5_1_ = sliced.offset._5_1_;
              input.value._6_1_ = sliced.offset._6_1_;
              input.value._7_1_ = sliced.offset._7_1_;
              input.value.pointer.length = (undefined4)sliced.offset;
              input.value.pointer.ptr = (char *)sliced.length;
              if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
                aVar54 = (anon_union_16_2_67f50693_for_value)
                         duckdb::SubstringASCII(result,sVar12,lVar44 + 1,lVar36);
              }
              else {
                aVar54.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     BlobSliceOperations::SliceValueWithSteps
                               (result,&sel,input,lVar44,lVar41,lVar45,&local_178);
              }
              puVar27[-1] = aVar54._0_8_;
              *puVar27 = aVar54.pointer.ptr;
            }
            local_1a8 = local_1a8 + iVar30;
          }
          pUVar38 = pUVar38 + 1;
          puVar27 = puVar27 + 2;
        } while (pUVar4 != pUVar38);
      }
      iVar30 = local_1a8;
      if ((SelectionVector *)local_1f0.ptr != (SelectionVector *)0x0) {
        SelectionVector::SelectionVector((SelectionVector *)&begin_4,local_1a8);
        if (iVar30 != 0) {
          iVar35 = 0;
          do {
            sVar39 = (sel_t)iVar35;
            if (sel.sel_vector != (sel_t *)0x0) {
              sVar39 = sel.sel_vector[iVar35];
            }
            *(sel_t *)(begin_4 + iVar35 * 4) = sVar39;
            iVar35 = iVar35 + 1;
          } while (iVar30 != iVar35);
        }
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        duckdb::Vector::Slice((SelectionVector *)local_1b8.ptr,(ulong)&begin_4);
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        duckdb::Vector::Flatten((ulong)local_1b8.ptr);
        duckdb::ListVector::SetListSize(result,iVar30);
        if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
        }
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
      }
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
      }
      if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
      }
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
      }
    }
    duckdb::Vector::Verify((ulong)result);
  }
  else {
    if (VVar3 != (Vector)0x65) {
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      str.offset = (uint64_t)local_108;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&str,"Specifier type not implemented","");
      duckdb::NotImplementedException::NotImplementedException(this,(string *)&str);
      __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (((byte)*result & 0xfd) != 0) {
      duckdb::Vector::Flatten((ulong)result);
    }
    if (pSVar23 == (SelectionVector *)0x0) {
      pSVar26 = (SelectionVector *)0x0;
    }
    else {
      pSVar26 = (SelectionVector *)duckdb::ListVector::GetEntry(result);
    }
    sel.sel_vector = (sel_t *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178 = 0;
    if (*result == (Vector)0x2) {
      if (*(byte **)(result + 0x28) == (byte *)0x0) {
        bVar50 = false;
      }
      else {
        bVar50 = (**(byte **)(result + 0x28) & 1) == 0;
      }
      if (*(byte **)(pvVar21 + 0x28) == (byte *)0x0) {
        bVar51 = false;
      }
      else {
        bVar51 = (**(byte **)(pvVar21 + 0x28) & 1) == 0;
      }
      if (*(byte **)(pvVar22 + 0x28) == (byte *)0x0) {
        bVar52 = false;
      }
      else {
        bVar52 = (**(byte **)(pvVar22 + 0x28) & 1) == 0;
      }
      _end_data = pSVar26;
      if (pSVar23 == (SelectionVector *)0x0) {
        bVar37 = 0;
        _begin_data = pSVar23;
      }
      else {
        _begin_data = pSVar23;
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
        p_Var5 = _begin_data[1].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar37 = 1;
        }
        else {
          bVar37 = *(byte *)&p_Var5->_vptr__Sp_counted_base & 1;
        }
      }
      if (((bVar50 || bVar51) || bVar52) || (_begin_data != (SelectionVector *)0x0 && bVar37 == 0))
      {
        duckdb::ConstantVector::SetNull(result,true);
      }
      else {
        plVar8 = *(list_entry_t **)(result + 0x20);
        plVar9 = *(long **)(pvVar21 + 0x20);
        puVar34 = *(uint64_t **)(pvVar22 + 0x20);
        if (_begin_data == (SelectionVector *)0x0) {
          peVar32 = (element_type *)0x0;
        }
        else {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          peVar32 = _begin_data[1].selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        str.length = plVar8->length;
        str.offset._0_4_ = (undefined4)plVar8->offset;
        str.offset._4_4_ = (undefined4)(plVar8->offset >> 0x20);
        if (FVar56 == (FunctionData)0x0) {
          begin = *plVar9;
        }
        else {
          begin = 0;
        }
        if (FVar2 == (FunctionData)0x0) {
          uVar48 = *puVar34;
          begin_4 = uVar48;
        }
        else {
          uVar48 = 0;
          begin_4 = str.length;
        }
        if (peVar32 == (element_type *)0x0) {
          lVar45 = 1;
        }
        else {
          lVar45 = *(long *)peVar32;
        }
        if ((lVar45 < 0) && (begin_4 = begin, begin = uVar48, FVar56 != (FunctionData)0x0)) {
          begin_4 = str.length;
        }
        bVar46 = lVar45 == 1 | bVar37;
        if (bVar46 == 1) {
          ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>(&str,&begin,&begin_4);
        }
        if ((bVar37 == 1 && lVar45 != 1) && (begin < begin_4)) {
          iVar30 = CalculateSliceLength<long>(begin,begin_4,lVar45,true);
          bVar50 = true;
          SelectionVector::Initialize(&sel,iVar30);
        }
        else {
          bVar50 = false;
          iVar30 = 0;
        }
        if (bVar46 == 0) {
          duckdb::ConstantVector::SetNull(result,true);
        }
        else {
          if (lVar45 == 1) {
            lVar55.length = begin_4 - begin;
            lVar55.offset =
                 (long)&((SelectionVector *)CONCAT44(str.offset._4_4_,(undefined4)str.offset))->
                        sel_vector + begin;
          }
          else {
            input_03.length = begin;
            input_03.offset = str.length;
            lVar55 = ListSliceOperations::SliceValueWithSteps
                               ((ListSliceOperations *)result,(Vector *)&sel,
                                (SelectionVector *)CONCAT44(str.offset._4_4_,(undefined4)str.offset)
                                ,input_03,begin_4,lVar45,(int64_t)&local_178,
                                (idx_t *)CONCAT17(FVar56,in_stack_fffffffffffffde8));
          }
          *plVar8 = lVar55;
        }
        if (bVar50) {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          duckdb::Vector::Slice(_end_data,(ulong)&sel);
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          duckdb::Vector::Flatten((ulong)_end_data);
          duckdb::ListVector::SetListSize(result,iVar30);
        }
      }
    }
    else {
      local_1f0.ptr = (Vector *)pSVar23;
      local_1b8.ptr = (Vector *)pSVar26;
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&begin);
      duckdb::Vector::ToUnifiedFormat((ulong)result,pUVar4);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar21,pUVar4);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar22,pUVar4);
      if ((SelectionVector *)local_1f0.ptr != (SelectionVector *)0x0) {
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1f0);
        duckdb::Vector::ToUnifiedFormat((ulong)local_1f0.ptr,pUVar4);
        iVar30 = duckdb::ListVector::GetListSize(result);
        SelectionVector::Initialize(&sel,iVar30);
      }
      lVar45 = *(long *)(result + 0x20);
      FlatVector::VerifyFlatVector(result);
      if (pUVar4 == (UnifiedVectorFormat *)0x0) {
        local_1a8 = 0;
      }
      else {
        puVar34 = (uint64_t *)(lVar45 + 8);
        local_1a8 = 0;
        pUVar38 = (UnifiedVectorFormat *)0x0;
        do {
          pUVar28 = pUVar38;
          if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
            pUVar28 = (UnifiedVectorFormat *)
                      (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                      (long)pUVar38 * 4);
          }
          pUVar40 = pUVar38;
          if (_begin_data->sel_vector != (sel_t *)0x0) {
            pUVar40 = (UnifiedVectorFormat *)(ulong)_begin_data->sel_vector[(long)pUVar38];
          }
          pUVar33 = pUVar38;
          if (_end_data->sel_vector != (sel_t *)0x0) {
            pUVar33 = (UnifiedVectorFormat *)(ulong)_end_data->sel_vector[(long)pUVar38];
          }
          if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
            pUVar31 = (UnifiedVectorFormat *)0x0;
          }
          else {
            pUVar31 = pUVar38;
            if (*(long *)begin != 0) {
              pUVar31 = (UnifiedVectorFormat *)(ulong)*(uint *)(*(long *)begin + (long)pUVar38 * 4);
            }
          }
          if (local_108[0] == 0) {
            bVar50 = false;
          }
          else {
            bVar50 = (*(ulong *)(local_108[0] + ((ulong)pUVar28 >> 6) * 8) >>
                      ((ulong)pUVar28 & 0x3f) & 1) == 0;
          }
          if (local_158 == 0) {
            bVar51 = false;
          }
          else {
            bVar51 = (*(ulong *)(local_158 + ((ulong)pUVar40 >> 6) * 8) >> ((ulong)pUVar40 & 0x3f) &
                     1) == 0;
          }
          if (local_70 == 0) {
            bVar52 = false;
          }
          else {
            bVar52 = (*(ulong *)(local_70 + ((ulong)pUVar33 >> 6) * 8) >> ((ulong)pUVar33 & 0x3f) &
                     1) == 0;
          }
          if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
            bVar49 = false;
          }
          else if (local_b8 == 0) {
            bVar49 = true;
          }
          else {
            bVar49 = (*(ulong *)(local_b8 + ((ulong)pUVar31 >> 6) * 8) >> ((ulong)pUVar31 & 0x3f) &
                     1) != 0;
          }
          if (((bVar50 || bVar51) || bVar52) ||
             ((SelectionVector *)local_1f0.ptr != (SelectionVector *)0x0 && bVar49 == false)) {
            if (*(long *)(result + 0x28) == 0) {
              sliced.offset._0_4_ = (undefined4)*(undefined8 *)(result + 0x40);
              sliced.offset._4_4_ = (undefined4)((ulong)*(undefined8 *)(result + 0x40) >> 0x20);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&begin_4,&sliced.offset);
              p_Var16 = p_Stack_1e0;
              lVar45 = begin_4;
              begin_4 = 0;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
              *(long *)(result + 0x30) = lVar45;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var16;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
              }
              pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )(result + 0x30));
              *(unsigned_long **)(result + 0x28) =
                   (pTVar29->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            bVar37 = (byte)pUVar38 & 0x3f;
            puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar38 >> 6) * 8);
            *puVar1 = *puVar1 & (-2L << bVar37 | 0xfffffffffffffffeU >> 0x40 - bVar37);
          }
          else {
            puVar27 = (undefined8 *)(str.length + (long)pUVar28 * 0x10);
            uVar10 = *puVar27;
            sliced.length = puVar27[1];
            sliced.offset._0_4_ = (undefined4)uVar10;
            sliced.offset._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
            if (FVar56 == (FunctionData)0x0) {
              begin_1 = *(long *)(lStack_160 + (long)pUVar40 * 8);
            }
            else {
              begin_1 = 0;
            }
            if (FVar2 == (FunctionData)0x0) {
              uVar48 = *(uint64_t *)(local_78 + (long)pUVar33 * 8);
              end = uVar48;
            }
            else {
              uVar48 = 0;
              end = sliced.length;
            }
            if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
              lVar45 = 1;
            }
            else {
              lVar45 = *(long *)(local_c0 + (long)pUVar31 * 8);
            }
            if ((lVar45 < 0) && (end = begin_1, begin_1 = uVar48, FVar56 != (FunctionData)0x0)) {
              end = sliced.length;
            }
            bVar37 = lVar45 == 1 | bVar49;
            if (bVar37 == 1) {
              ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>
                        (&sliced,&begin_1,&end);
            }
            lVar44 = begin_1;
            lVar41 = end;
            uVar48 = end - begin_1;
            if (uVar48 == 0 || end < begin_1) {
              iVar30 = 0;
            }
            else {
              iVar30 = CalculateSliceLength<long>(begin_1,end,lVar45,bVar49);
            }
            if (bVar37 == 0) {
              if (*(long *)(result + 0x28) == 0) {
                local_170 = *(unsigned_long *)(result + 0x40);
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&begin_4,&local_170);
                p_Var16 = p_Stack_1e0;
                lVar45 = begin_4;
                begin_4 = 0;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                *(long *)(result + 0x30) = lVar45;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var16;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
                }
                pTVar29 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)(result + 0x30));
                *(unsigned_long **)(result + 0x28) =
                     (pTVar29->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              }
              bVar37 = (byte)pUVar38 & 0x3f;
              puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar38 >> 6) * 8);
              *puVar1 = *puVar1 & (-2L << bVar37 | 0xfffffffffffffffeU >> 0x40 - bVar37);
            }
            else if ((SelectionVector *)local_1f0.ptr == (SelectionVector *)0x0) {
              puVar34[-1] = (long)&((SelectionVector *)
                                   CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))->
                                   sel_vector + lVar44;
              *puVar34 = uVar48;
            }
            else {
              lVar53.length = lVar44;
              lVar53.offset = sliced.length;
              lVar53 = ListSliceOperations::SliceValueWithSteps
                                 ((ListSliceOperations *)result,(Vector *)&sel,
                                  (SelectionVector *)
                                  CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar53,
                                  lVar41,lVar45,(int64_t)&local_178,
                                  (idx_t *)CONCAT17(FVar56,in_stack_fffffffffffffde8));
              puVar34[-1] = lVar53.offset;
              *puVar34 = lVar53.length;
            }
            local_1a8 = local_1a8 + iVar30;
          }
          pUVar38 = pUVar38 + 1;
          puVar34 = puVar34 + 2;
        } while (pUVar4 != pUVar38);
      }
      iVar30 = local_1a8;
      if ((SelectionVector *)local_1f0.ptr != (SelectionVector *)0x0) {
        SelectionVector::SelectionVector((SelectionVector *)&begin_4,local_1a8);
        if (iVar30 != 0) {
          iVar35 = 0;
          do {
            sVar39 = (sel_t)iVar35;
            if (sel.sel_vector != (sel_t *)0x0) {
              sVar39 = sel.sel_vector[iVar35];
            }
            *(sel_t *)(begin_4 + iVar35 * 4) = sVar39;
            iVar35 = iVar35 + 1;
          } while (iVar30 != iVar35);
        }
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        duckdb::Vector::Slice((SelectionVector *)local_1b8.ptr,(ulong)&begin_4);
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        duckdb::Vector::Flatten((ulong)local_1b8.ptr);
        duckdb::ListVector::SetListSize(result,iVar30);
        if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
        }
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
      }
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
      }
      if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
      }
      if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      }
      if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
      }
    }
    duckdb::Vector::Verify((ulong)result);
  }
  if (sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void ArraySliceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3 || args.ColumnCount() == 4);
	D_ASSERT(args.data.size() == 3 || args.data.size() == 4);
	auto count = args.size();

	Vector &list_or_str_vector = result;
	// this ensures that we do not change the input chunk
	VectorOperations::Copy(args.data[0], list_or_str_vector, count, 0, 0);

	if (list_or_str_vector.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	Vector &begin_vector = args.data[1];
	Vector &end_vector = args.data[2];

	optional_ptr<Vector> step_vector;
	if (args.ColumnCount() == 4) {
		step_vector = &args.data[3];
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSliceBindData>();
	auto begin_is_empty = info.begin_is_empty;
	auto end_is_empty = info.end_is_empty;

	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
	switch (result.GetType().id()) {
	case LogicalTypeId::LIST: {
		// Share the value dictionary as we are just going to slice it
		if (list_or_str_vector.GetVectorType() != VectorType::FLAT_VECTOR &&
		    list_or_str_vector.GetVectorType() != VectorType::CONSTANT_VECTOR) {
			list_or_str_vector.Flatten(count);
		}
		ExecuteSlice<list_entry_t, int64_t, ListSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                         step_vector, count, begin_is_empty, end_is_empty);
		break;
	}
	case LogicalTypeId::BLOB:
		ExecuteSlice<string_t, int64_t, BlobSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                     step_vector, count, begin_is_empty, end_is_empty);
		break;
	case LogicalTypeId::VARCHAR:
		ExecuteSlice<string_t, int64_t, StringSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                       step_vector, count, begin_is_empty, end_is_empty);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented");
	}
}